

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QRect __thiscall
QItemDelegate::textRectangle
          (QItemDelegate *this,QPainter *param_2,QRect *rect,QFont *font,QString *text)

{
  QRect QVar1;
  QItemDelegatePrivate *pQVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QSizeF QVar4;
  int textMargin;
  QItemDelegatePrivate *d;
  QSize size;
  QSizeF fpSize;
  QRect *this_00;
  QString *in_stack_ffffffffffffff20;
  QSize *this_01;
  QRect *this_02;
  QItemDelegatePrivate *in_stack_ffffffffffffff38;
  QSizeF *this_03;
  QSizeF local_58;
  QRect local_48;
  QSize local_30 [3];
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QItemDelegate *)0x850c45);
  QTextOption::setWrapMode(&pQVar2->textOption,WordWrap);
  QTextLayout::setTextOption((QTextOption *)&pQVar2->textLayout);
  QTextLayout::setFont((QFont *)&pQVar2->textLayout);
  this_00 = (QRect *)&pQVar2->textLayout;
  this_02 = &local_48;
  QString::QString(in_stack_ffffffffffffff20,(QString *)this_00);
  this_01 = local_30;
  QItemDelegatePrivate::replaceNewLine((QString *)this_02);
  QTextLayout::setText((QString *)this_00);
  QString::~QString((QString *)0x850ce6);
  QString::~QString((QString *)0x850cf0);
  local_58.wd = -NAN;
  local_58.ht = -NAN;
  QRect::width(this_00);
  QVar4 = QItemDelegatePrivate::doTextLayout(in_stack_ffffffffffffff38,(int)((ulong)pQVar2 >> 0x20))
  ;
  local_58.ht = QVar4.ht;
  local_58.wd = QVar4.wd;
  this_03 = &local_58;
  QSizeF::width(this_03);
  qCeil<double>(4.30810717643579e-317);
  QSizeF::height(this_03);
  qCeil<double>(4.30811656368306e-317);
  QSize::QSize(this_01,(int)((ulong)this_00 >> 0x20),(int)this_00);
  pQVar3 = QApplication::style();
  (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x41,0);
  QSize::width((QSize *)0x850db7);
  QSize::height((QSize *)0x850dd2);
  QRect::QRect(this_02,(int)((ulong)this_01 >> 0x20),(int)this_01,(int)((ulong)this_00 >> 0x20),
               (int)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.x2.m_i = (undefined4)local_10;
    QVar1.y2.m_i = local_10._4_4_;
    QVar1.x1.m_i = (undefined4)local_18;
    QVar1.y1.m_i = local_18._4_4_;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRect QItemDelegate::textRectangle(QPainter * /*painter*/, const QRect &rect,
                                   const QFont &font, const QString &text) const
{
    Q_D(const QItemDelegate);
    d->textOption.setWrapMode(QTextOption::WordWrap);
    d->textLayout.setTextOption(d->textOption);
    d->textLayout.setFont(font);
    d->textLayout.setText(QItemDelegatePrivate::replaceNewLine(text));
    QSizeF fpSize = d->doTextLayout(rect.width());
    const QSize size = QSize(qCeil(fpSize.width()), qCeil(fpSize.height()));
    // ###: textRectangle should take style option as argument
    const int textMargin = QApplication::style()->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr) + 1;
    return QRect(0, 0, size.width() + 2 * textMargin, size.height());
}